

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomActionGroup::read(DomActionGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  bool bVar1;
  int iVar2;
  const_iterator o;
  DomAction *this_00;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomProperty *v_3;
  DomProperty *v_2;
  DomActionGroup *v_1;
  DomAction *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffd88;
  DomProperty *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  byte in_stack_fffffffffffffd9f;
  DomProperty *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  byte in_stack_fffffffffffffdaf;
  DomActionGroup *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbf;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffd90);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffd90);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1a4e3a);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (size_t)in_stack_fffffffffffffda0);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffda0,
               (QString *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffd90,
                         (QStringView *)in_stack_fffffffffffffd88);
    QString::~QString((QString *)0x1a4e9e);
    if (bVar1) {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a4eb5);
      QStringView::toString((QStringView *)in_stack_fffffffffffffd90);
      setAttributeName((DomActionGroup *)in_stack_fffffffffffffd90,
                       &in_stack_fffffffffffffd88->m_attr_name);
      QString::~QString((QString *)0x1a4ef9);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                 (size_t)in_stack_fffffffffffffd90);
      ::operator+((QLatin1String *)in_stack_fffffffffffffd90,
                  (QStringView *)in_stack_fffffffffffffd88);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffd88);
      QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
      QString::~QString((QString *)0x1a4f7a);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1a4f9b);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a53de;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (size_t)in_stack_fffffffffffffda0);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffda0,
                 (QString *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
      sVar3 = 0;
      other.m_data._0_7_ = in_stack_fffffffffffffdb8;
      other.m_size = (qsizetype)in_stack_fffffffffffffdb0;
      other.m_data._7_1_ = in_stack_fffffffffffffdbf;
      iVar2 = QStringView::compare((QStringView *)in_stack_fffffffffffffd88,other,CaseInsensitive);
      QString::~QString((QString *)0x1a5073);
      if (iVar2 == 0) {
        this_00 = (DomAction *)operator_new(0x70);
        memset(this_00,0,0x70);
        DomAction::DomAction((DomAction *)in_stack_fffffffffffffd90);
        DomAction::read(this_00,__fd,__buf_00,sVar3);
        QList<DomAction_*>::append
                  ((QList<DomAction_*> *)0x1a50dd,(parameter_type)in_stack_fffffffffffffd88);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                   (size_t)in_stack_fffffffffffffda0);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffda0,
                   (QString *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
        sVar3 = 0;
        other_00.m_data._0_7_ = in_stack_fffffffffffffdb8;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffdb0;
        other_00.m_data._7_1_ = in_stack_fffffffffffffdbf;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffd88,other_00,CaseInsensitive);
        in_stack_fffffffffffffdbf = iVar2 != 0 ^ 0xff;
        QString::~QString((QString *)0x1a5148);
        if ((in_stack_fffffffffffffdbf & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                     (size_t)in_stack_fffffffffffffda0);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffda0,
                     (QString *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
          sVar3 = 0;
          other_01.m_data._0_7_ = in_stack_fffffffffffffdb8;
          other_01.m_size = (qsizetype)in_stack_fffffffffffffdb0;
          other_01.m_data._7_1_ = in_stack_fffffffffffffdbf;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffd88,other_01,CaseInsensitive);
          in_stack_fffffffffffffdaf = iVar2 != 0 ^ 0xff;
          QString::~QString((QString *)0x1a5214);
          if ((in_stack_fffffffffffffdaf & 1) == 0) {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                       (size_t)in_stack_fffffffffffffda0);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffffda0,
                       (QString *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
            sVar3 = 0;
            other_02.m_data._0_7_ = in_stack_fffffffffffffdb8;
            other_02.m_size = (qsizetype)in_stack_fffffffffffffdb0;
            other_02.m_data._7_1_ = in_stack_fffffffffffffdbf;
            iVar2 = QStringView::compare
                              ((QStringView *)in_stack_fffffffffffffd88,other_02,CaseInsensitive);
            in_stack_fffffffffffffd9f = iVar2 != 0 ^ 0xff;
            QString::~QString((QString *)0x1a52e0);
            if ((in_stack_fffffffffffffd9f & 1) == 0) {
              in_stack_fffffffffffffd88 = (parameter_type)CONCAT44(in_register_00000034,__fd);
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                         (size_t)in_stack_fffffffffffffd90);
              ::operator+((QLatin1String *)in_stack_fffffffffffffd90,
                          (QStringView *)in_stack_fffffffffffffd88);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                         in_stack_fffffffffffffd88);
              QXmlStreamReader::raiseError(&in_stack_fffffffffffffd88->m_attr_name);
              QString::~QString((QString *)0x1a53c3);
            }
            else {
              in_stack_fffffffffffffd90 = (DomProperty *)operator_new(0x178);
              memset(in_stack_fffffffffffffd90,0,0x178);
              DomProperty::DomProperty(in_stack_fffffffffffffd90);
              DomProperty::read(in_stack_fffffffffffffd90,__fd,__buf_03,sVar3);
              QList<DomProperty_*>::append
                        ((QList<DomProperty_*> *)0x1a5341,in_stack_fffffffffffffd88);
            }
          }
          else {
            in_stack_fffffffffffffda0 = (DomProperty *)operator_new(0x178);
            memset(in_stack_fffffffffffffda0,0,0x178);
            DomProperty::DomProperty(in_stack_fffffffffffffd90);
            DomProperty::read(in_stack_fffffffffffffda0,__fd,__buf_02,sVar3);
            QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1a5275,in_stack_fffffffffffffd88)
            ;
          }
        }
        else {
          in_stack_fffffffffffffdb0 = (DomActionGroup *)operator_new(0x80);
          memset(in_stack_fffffffffffffdb0,0,0x80);
          DomActionGroup((DomActionGroup *)in_stack_fffffffffffffd90);
          read(in_stack_fffffffffffffdb0,__fd,__buf_01,sVar3);
          QList<DomActionGroup_*>::append
                    ((QList<DomActionGroup_*> *)0x1a51a9,(parameter_type)in_stack_fffffffffffffd88);
        }
      }
    }
  } while (iVar2 != 5);
LAB_001a53de:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1a53eb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomActionGroup::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"action"_s, Qt::CaseInsensitive)) {
                auto *v = new DomAction();
                v->read(reader);
                m_action.append(v);
                continue;
            }
            if (!tag.compare(u"actiongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionGroup();
                v->read(reader);
                m_actionGroup.append(v);
                continue;
            }
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}